

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_databases.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_bae86::Json2Array<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType>::
Json2Array(Json2Array<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType> *this,Value *value,
          vector<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType,_std::allocator<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_68 [8];
  RdsDescribeDatabasesAccountPrivilegeInfoType val;
  int i;
  vector<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType,_std::allocator<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.account_privilege.field_2._12_4_ = 0; uVar1 = val.account_privilege.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.account_privilege.field_2._12_4_ = val.account_privilege.field_2._12_4_ + 1) {
      aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType::
      RdsDescribeDatabasesAccountPrivilegeInfoType
                ((RdsDescribeDatabasesAccountPrivilegeInfoType *)local_68);
      value_00 = Json::Value::operator[](value,val.account_privilege.field_2._12_4_);
      anon_unknown.dwarf_bae86::Json2Type
                (value_00,(RdsDescribeDatabasesAccountPrivilegeInfoType *)local_68);
      std::
      vector<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType,_std::allocator<aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType>_>
      ::push_back(vec,(value_type *)local_68);
      aliyun::RdsDescribeDatabasesAccountPrivilegeInfoType::
      ~RdsDescribeDatabasesAccountPrivilegeInfoType
                ((RdsDescribeDatabasesAccountPrivilegeInfoType *)local_68);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }